

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivateContainer::updateTopBottomMargin(QComboBoxPrivateContainer *this)

{
  int iVar1;
  Policy hPolicy;
  QLayout *pQVar2;
  QBoxLayout *pQVar3;
  QStyle *pQVar4;
  long *plVar5;
  QSpacerItem *pQVar6;
  QSpacerItem *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QSpacerItem *bottomSpacer;
  QSpacerItem *topSpacer;
  int margin;
  bool usePopup;
  QBoxLayout *boxLayout;
  QStyleOptionComboBox opt;
  QWidget *in_stack_ffffffffffffff28;
  QBoxLayout *pQVar7;
  Policy in_stack_ffffffffffffff30;
  QSpacerItem *in_stack_ffffffffffffff40;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff48;
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QWidget::layout((QWidget *)0x5344e0);
  if (pQVar2 != (QLayout *)0x0) {
    pQVar2 = QWidget::layout((QWidget *)0x5344f0);
    iVar1 = (**(code **)(*(long *)pQVar2 + 200))();
    if (0 < iVar1) {
      QWidget::layout((QWidget *)0x534510);
      pQVar3 = qobject_cast<QBoxLayout*>((QObject *)0x534518);
      if (pQVar3 != (QBoxLayout *)0x0) {
        memset(local_98,0xaa,0x90);
        comboStyleOption(in_stack_ffffffffffffff48);
        pQVar4 = QWidget::style(in_stack_ffffffffffffff28);
        iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))
                          (pQVar4,0x19,local_98,*(undefined8 *)(in_RDI + 0x48),0);
        if (iVar1 == 0) {
          hPolicy = Fixed;
        }
        else {
          pQVar4 = QWidget::style(in_stack_ffffffffffffff28);
          hPolicy = (**(code **)(*(long *)pQVar4 + 0xe0))
                              (pQVar4,0x1d,local_98,*(undefined8 *)(in_RDI + 0x48));
        }
        plVar5 = (long *)(**(code **)(*(long *)&pQVar3->super_QLayout + 0xa8))(pQVar3,0);
        pQVar6 = (QSpacerItem *)(**(code **)(*plVar5 + 0x78))();
        if (pQVar6 != (QSpacerItem *)0x0) {
          QSpacerItem::changeSize
                    (in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,hPolicy,
                     in_stack_ffffffffffffff30);
        }
        pQVar7 = pQVar3;
        iVar1 = (**(code **)(*(long *)&pQVar3->super_QLayout + 200))();
        plVar5 = (long *)(**(code **)(*(long *)&pQVar7->super_QLayout + 0xa8))(pQVar7,iVar1 + -1);
        this_00 = (QSpacerItem *)(**(code **)(*plVar5 + 0x78))();
        if ((this_00 != (QSpacerItem *)0x0) && (this_00 != pQVar6)) {
          QSpacerItem::changeSize
                    (this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,hPolicy,
                     in_stack_ffffffffffffff30);
        }
        (**(code **)(*(long *)&pQVar3->super_QLayout + 0x70))();
        QStyleOptionComboBox::~QStyleOptionComboBox
                  ((QStyleOptionComboBox *)CONCAT44(hPolicy,in_stack_ffffffffffffff30));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivateContainer::updateTopBottomMargin()
{
    if (!layout() || layout()->count() < 1)
        return;

    QBoxLayout *boxLayout = qobject_cast<QBoxLayout *>(layout());
    if (!boxLayout)
        return;

    const QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
    const int margin = usePopup ? combo->style()->pixelMetric(QStyle::PM_MenuVMargin, &opt, combo) : 0;

    QSpacerItem *topSpacer = boxLayout->itemAt(0)->spacerItem();
    if (topSpacer)
        topSpacer->changeSize(0, margin, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QSpacerItem *bottomSpacer = boxLayout->itemAt(boxLayout->count() - 1)->spacerItem();
    if (bottomSpacer && bottomSpacer != topSpacer)
        bottomSpacer->changeSize(0, margin, QSizePolicy::Minimum, QSizePolicy::Fixed);

    boxLayout->invalidate();
}